

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O1

bool __thiscall Minisat::SimpSolver::asymmVar(SimpSolver *this,Var v)

{
  bool bVar1;
  vec<unsigned_int> *pvVar2;
  long lVar3;
  Var local_1c;
  
  local_1c = v;
  if ((this->occurs).dirty.data[v] != '\0') {
    OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>::clean
              (&this->occurs,&local_1c);
  }
  bVar1 = true;
  if ((((this->super_Solver).assigns.data[local_1c].value & 2) != 0) &&
     (pvVar2 = (this->occurs).occs.data + local_1c, pvVar2->sz != 0)) {
    if (0 < pvVar2->sz) {
      lVar3 = 0;
      do {
        bVar1 = asymm(this,local_1c,pvVar2->data[lVar3]);
        if (!bVar1) {
          return false;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < pvVar2->sz);
    }
    bVar1 = backwardSubsumptionCheck(this,false);
  }
  return bVar1;
}

Assistant:

bool SimpSolver::asymmVar(Var v)
{
    assert(use_simplification);

    const vec<CRef> &cls = occurs.lookup(v);

    if (value(v) != l_Undef || cls.size() == 0) return true;

    for (int i = 0; i < cls.size(); i++)
        if (!asymm(v, cls[i])) return false;

    return backwardSubsumptionCheck();
}